

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O3

Iterator __thiscall
HashMap<int,_int>::insert(HashMap<int,_int> *this,Iterator *position,int *key,int *value)

{
  int iVar1;
  Item *pIVar2;
  Item **ppIVar3;
  ItemBlock *pIVar4;
  Item *pIVar5;
  Item *pIVar6;
  Iterator *pIVar7;
  ulong size;
  
  if (this->data == (Item **)0x0) {
    size = this->capacity << 3;
    ppIVar3 = (Item **)operator_new__(size);
    this->data = ppIVar3;
    Memory::zero(ppIVar3,size);
  }
  else {
    for (pIVar6 = this->data[(ulong)(long)*key % this->capacity]; pIVar6 != (Item *)0x0;
        pIVar6 = pIVar6->nextCell) {
      if (pIVar6->key == *key) {
        if (pIVar6 != (this->_end).item) {
          pIVar6->value = *value;
          return (Iterator)pIVar6;
        }
        break;
      }
    }
  }
  pIVar6 = this->freeItem;
  if (pIVar6 == (Item *)0x0) {
    pIVar4 = (ItemBlock *)operator_new__(0xa8);
    pIVar4->next = this->blocks;
    this->blocks = pIVar4;
    pIVar4[9].next = (ItemBlock *)0x0;
    pIVar4[0xe].next = pIVar4 + 6;
    pIVar5 = (Item *)(pIVar4 + 0x10);
    pIVar4[0x13].next = pIVar4 + 0xb;
    pIVar6 = (Item *)(pIVar4 + 1);
  }
  else {
    pIVar5 = pIVar6->prev;
  }
  this->freeItem = pIVar5;
  iVar1 = *key;
  pIVar6->key = iVar1;
  pIVar6->value = *value;
  ppIVar3 = this->data + (ulong)(long)iVar1 % this->capacity;
  pIVar6->cell = ppIVar3;
  pIVar5 = *ppIVar3;
  pIVar6->nextCell = pIVar5;
  if (pIVar5 != (Item *)0x0) {
    pIVar5->cell = &pIVar6->nextCell;
  }
  *ppIVar3 = pIVar6;
  pIVar5 = position->item;
  pIVar2 = pIVar5->prev;
  pIVar6->prev = pIVar2;
  pIVar7 = (Iterator *)&pIVar2->next;
  if (pIVar2 == (Item *)0x0) {
    pIVar7 = &this->_begin;
  }
  pIVar7->item = pIVar6;
  pIVar6->next = pIVar5;
  pIVar5->prev = pIVar6;
  this->_size = this->_size + 1;
  return (Iterator)pIVar6;
}

Assistant:

Iterator insert(const Iterator& position, const T& key, const V& value)
  {
    Iterator it = find(key);
    if(it != _end)
    {
      *it = value;
      return it;
    }

    if(!data)
    {
      data = (Item**)new char[sizeof(Item*) * capacity];
      Memory::zero(data, sizeof(Item*) * capacity);
    }
    
    Item* item;
    if(freeItem)
    {
      item = freeItem;
      freeItem = freeItem->prev;
    }
    else
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      item = (Item*)((char*)itemBlock + sizeof(ItemBlock));

      for(Item* i = item + 1, * end = item + 4; i < end; ++i)
      {
        i->prev = freeItem;
        freeItem = i;
      }
    }

    usize hashCode = hash(key);
#ifdef VERIFY
    VERIFY(new(item) Item(key, value) == item);
#else
    new(item) Item(key, value);
#endif

    Item** cell;
    item->cell = (cell = &data[hashCode % capacity]);
    if((item->nextCell = *cell))
      item->nextCell->cell = &item->nextCell;
    *cell = item;
    
    Item* insertPos = position.item;
    if((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;

    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return item;
  }